

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaAttDef.cpp
# Opt level: O1

void __thiscall xercesc_4_0::SchemaAttDef::serialize(SchemaAttDef *this,XSerializeEngine *serEng)

{
  QName *pQVar1;
  DatatypeValidator *pDVar2;
  SchemaAttDef *pSVar3;
  size_t in_RCX;
  XSerializeEngine *__nbytes;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int i;
  PSVIScope local_1c;
  
  XMLAttDef::serialize(&this->super_XMLAttDef,serEng);
  if (serEng->fStoreLoad != 0) {
    XSerializeEngine::readSize(serEng,&this->fElemId);
    XSerializeEngine::operator>>(serEng,(int *)&local_1c);
    this->fPSVIScope = local_1c;
    pQVar1 = (QName *)XSerializeEngine::read(serEng,0x4250b0,__buf,in_RCX);
    this->fAttName = pQVar1;
    pDVar2 = DatatypeValidator::loadDV(serEng);
    this->fDatatypeValidator = pDVar2;
    __nbytes = serEng;
    XTemplateSerializer::loadObject(&this->fNamespaceList,8,false,serEng);
    pSVar3 = (SchemaAttDef *)XSerializeEngine::read(serEng,0x446a60,__buf_00,(size_t)__nbytes);
    this->fBaseAttDecl = pSVar3;
    return;
  }
  XSerializeEngine::writeSize(serEng,this->fElemId);
  XSerializeEngine::operator<<(serEng,this->fPSVIScope);
  XSerializeEngine::write(serEng,(int)this->fAttName,__buf_01,in_RCX);
  DatatypeValidator::storeDV(serEng,this->fDatatypeValidator);
  XTemplateSerializer::storeObject(this->fNamespaceList,serEng);
  XSerializeEngine::write(serEng,(int)this->fBaseAttDecl,__buf_02,in_RCX);
  return;
}

Assistant:

void SchemaAttDef::serialize(XSerializeEngine& serEng)
{

    XMLAttDef::serialize(serEng);

    if (serEng.isStoring())
    {
        serEng.writeSize (fElemId);
        serEng<<(int)fPSVIScope;

        serEng<<fAttName;

        DatatypeValidator::storeDV(serEng, fDatatypeValidator);

        /***
         * Serialize ValueVectorOf<unsigned int>
         ***/
        XTemplateSerializer::storeObject(fNamespaceList, serEng);

        serEng<<fBaseAttDecl;
    }
    else
    {

        serEng.readSize (fElemId);
        int i;
        serEng>>i;
        fPSVIScope = (PSVIDefs::PSVIScope)i;

        serEng>>fAttName;

        fDatatypeValidator    = DatatypeValidator::loadDV(serEng);

        /***
         * Deserialize ValueVectorOf<unsigned int>
         ***/
        XTemplateSerializer::loadObject(&fNamespaceList, 8, false, serEng);

        serEng>>fBaseAttDecl;
    }
}